

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tle.cc
# Opt level: O1

void __thiscall Tle::Initialize(Tle *this)

{
  string *psVar1;
  string *psVar2;
  TleException *this_00;
  int iVar3;
  ulong uVar4;
  Tle *pTVar5;
  double local_68;
  double day;
  uint local_58;
  uint sat_number_1;
  uint sat_number_2;
  uint year;
  char local_40 [16];
  
  if ((this->line_one_)._M_string_length == 0x45) {
    if ((this->line_two_)._M_string_length == 0x45) {
      psVar1 = &this->line_one_;
      if (*(psVar1->_M_dataplus)._M_p == '1') {
        psVar2 = &this->line_two_;
        if (*(psVar2->_M_dataplus)._M_p == '2') {
          pTVar5 = (Tle *)&sat_number_2;
          std::__cxx11::string::substr((ulong)&sat_number_2,(ulong)psVar1);
          ExtractInteger(pTVar5,(string *)&sat_number_2,(uint *)((long)&day + 4));
          if (_sat_number_2 != local_40) {
            operator_delete(_sat_number_2);
          }
          pTVar5 = (Tle *)&sat_number_2;
          std::__cxx11::string::substr((ulong)&sat_number_2,(ulong)psVar2);
          ExtractInteger(pTVar5,(string *)&sat_number_2,&local_58);
          if (_sat_number_2 != local_40) {
            operator_delete(_sat_number_2);
          }
          if (day._4_4_ == local_58) {
            this->norad_number_ = day._4_4_;
            if ((this->name_)._M_string_length == 0) {
              std::__cxx11::string::substr((ulong)&sat_number_2,(ulong)psVar1);
              std::__cxx11::string::operator=((string *)this,(string *)&sat_number_2);
              if (_sat_number_2 != local_40) {
                operator_delete(_sat_number_2);
              }
            }
            std::__cxx11::string::substr((ulong)&sat_number_2,(ulong)psVar1);
            std::__cxx11::string::operator=
                      ((string *)&this->int_designator_,(string *)&sat_number_2);
            if (_sat_number_2 != local_40) {
              operator_delete(_sat_number_2);
            }
            sat_number_1 = 0;
            local_68 = 0.0;
            pTVar5 = (Tle *)&sat_number_2;
            std::__cxx11::string::substr((ulong)&sat_number_2,(ulong)psVar1);
            ExtractInteger(pTVar5,(string *)&sat_number_2,&sat_number_1);
            if (_sat_number_2 != local_40) {
              operator_delete(_sat_number_2);
            }
            pTVar5 = (Tle *)&sat_number_2;
            std::__cxx11::string::substr((ulong)&sat_number_2,(ulong)psVar1);
            ExtractDouble(pTVar5,(string *)&sat_number_2,4,&local_68);
            if (_sat_number_2 != local_40) {
              operator_delete(_sat_number_2);
            }
            pTVar5 = (Tle *)&sat_number_2;
            std::__cxx11::string::substr((ulong)&sat_number_2,(ulong)psVar1);
            ExtractDouble(pTVar5,(string *)&sat_number_2,2,&this->mean_motion_dt2_);
            if (_sat_number_2 != local_40) {
              operator_delete(_sat_number_2);
            }
            pTVar5 = (Tle *)&sat_number_2;
            std::__cxx11::string::substr((ulong)&sat_number_2,(ulong)psVar1);
            ExtractExponential(pTVar5,(string *)&sat_number_2,&this->mean_motion_ddt6_);
            if (_sat_number_2 != local_40) {
              operator_delete(_sat_number_2);
            }
            pTVar5 = (Tle *)&sat_number_2;
            std::__cxx11::string::substr((ulong)&sat_number_2,(ulong)psVar1);
            ExtractExponential(pTVar5,(string *)&sat_number_2,&this->bstar_);
            if (_sat_number_2 != local_40) {
              operator_delete(_sat_number_2);
            }
            pTVar5 = (Tle *)&sat_number_2;
            std::__cxx11::string::substr((ulong)&sat_number_2,(ulong)psVar2);
            ExtractDouble(pTVar5,(string *)&sat_number_2,4,&this->inclination_);
            if (_sat_number_2 != local_40) {
              operator_delete(_sat_number_2);
            }
            pTVar5 = (Tle *)&sat_number_2;
            std::__cxx11::string::substr((ulong)&sat_number_2,(ulong)psVar2);
            ExtractDouble(pTVar5,(string *)&sat_number_2,4,&this->right_ascending_node_);
            if (_sat_number_2 != local_40) {
              operator_delete(_sat_number_2);
            }
            pTVar5 = (Tle *)&sat_number_2;
            std::__cxx11::string::substr((ulong)&sat_number_2,(ulong)psVar2);
            ExtractDouble(pTVar5,(string *)&sat_number_2,-1,&this->eccentricity_);
            if (_sat_number_2 != local_40) {
              operator_delete(_sat_number_2);
            }
            pTVar5 = (Tle *)&sat_number_2;
            std::__cxx11::string::substr((ulong)&sat_number_2,(ulong)psVar2);
            ExtractDouble(pTVar5,(string *)&sat_number_2,4,&this->argument_perigee_);
            if (_sat_number_2 != local_40) {
              operator_delete(_sat_number_2);
            }
            pTVar5 = (Tle *)&sat_number_2;
            std::__cxx11::string::substr((ulong)&sat_number_2,(ulong)psVar2);
            ExtractDouble(pTVar5,(string *)&sat_number_2,4,&this->mean_anomaly_);
            if (_sat_number_2 != local_40) {
              operator_delete(_sat_number_2);
            }
            pTVar5 = (Tle *)&sat_number_2;
            std::__cxx11::string::substr((ulong)&sat_number_2,(ulong)psVar2);
            ExtractDouble(pTVar5,(string *)&sat_number_2,3,&this->mean_motion_);
            if (_sat_number_2 != local_40) {
              operator_delete(_sat_number_2);
            }
            pTVar5 = (Tle *)&sat_number_2;
            std::__cxx11::string::substr((ulong)&sat_number_2,(ulong)psVar2);
            ExtractInteger(pTVar5,(string *)&sat_number_2,&this->orbit_number_);
            if (_sat_number_2 != local_40) {
              operator_delete(_sat_number_2);
            }
            iVar3 = sat_number_1 + 2000;
            if (0x38 < sat_number_1) {
              iVar3 = sat_number_1 + 0x76c;
            }
            uVar4 = (ulong)(iVar3 - 1U);
            (this->epoch_).m_encoded =
                 (long)(((double)(long)(uVar4 / 400 +
                                       (((ulong)(iVar3 - 1U >> 2) + uVar4 * 0x16d) - uVar4 / 100)) +
                         local_68 + -1.0) * 86400000000.0);
            return;
          }
          this_00 = (TleException *)__cxa_allocate_exception(0x10);
          TleException::TleException(this_00,"Satellite numbers do not match");
        }
        else {
          this_00 = (TleException *)__cxa_allocate_exception(0x10);
          TleException::TleException(this_00,"Invalid line beginning for line two");
        }
      }
      else {
        this_00 = (TleException *)__cxa_allocate_exception(0x10);
        TleException::TleException(this_00,"Invalid line beginning for line one");
      }
    }
    else {
      this_00 = (TleException *)__cxa_allocate_exception(0x10);
      TleException::TleException(this_00,"Invalid length for line two");
    }
  }
  else {
    this_00 = (TleException *)__cxa_allocate_exception(0x10);
    TleException::TleException(this_00,"Invalid length for line one");
  }
  __cxa_throw(this_00,&TleException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Tle::Initialize()
{
    if (!IsValidLineLength(line_one_))
    {
        throw TleException("Invalid length for line one");
    }

    if (!IsValidLineLength(line_two_))
    {
        throw TleException("Invalid length for line two");
    }

    if (line_one_[0] != '1')
    {
        throw TleException("Invalid line beginning for line one");
    }
        
    if (line_two_[0] != '2')
    {
        throw TleException("Invalid line beginning for line two");
    }

    unsigned int sat_number_1;
    unsigned int sat_number_2;

    ExtractInteger(line_one_.substr(TLE1_COL_NORADNUM,
                TLE1_LEN_NORADNUM), sat_number_1);
    ExtractInteger(line_two_.substr(TLE2_COL_NORADNUM,
                TLE2_LEN_NORADNUM), sat_number_2);

    if (sat_number_1 != sat_number_2)
    {
        throw TleException("Satellite numbers do not match");
    }

    norad_number_ = sat_number_1;

    if (name_.empty())
    {
        name_ = line_one_.substr(TLE1_COL_NORADNUM, TLE1_LEN_NORADNUM);
    }

    int_designator_ = line_one_.substr(TLE1_COL_INTLDESC_A,
            TLE1_LEN_INTLDESC_A + TLE1_LEN_INTLDESC_B + TLE1_LEN_INTLDESC_C);

    unsigned int year = 0;
    double day = 0.0;

    ExtractInteger(line_one_.substr(TLE1_COL_EPOCH_A,
                TLE1_LEN_EPOCH_A), year);
    ExtractDouble(line_one_.substr(TLE1_COL_EPOCH_B,
                TLE1_LEN_EPOCH_B), 4, day);
    ExtractDouble(line_one_.substr(TLE1_COL_MEANMOTIONDT2,
                TLE1_LEN_MEANMOTIONDT2), 2, mean_motion_dt2_);
    ExtractExponential(line_one_.substr(TLE1_COL_MEANMOTIONDDT6,
                TLE1_LEN_MEANMOTIONDDT6), mean_motion_ddt6_);
    ExtractExponential(line_one_.substr(TLE1_COL_BSTAR,
                TLE1_LEN_BSTAR), bstar_);

    /*
     * line 2
     */
    ExtractDouble(line_two_.substr(TLE2_COL_INCLINATION,
                TLE2_LEN_INCLINATION), 4, inclination_);
    ExtractDouble(line_two_.substr(TLE2_COL_RAASCENDNODE,
                TLE2_LEN_RAASCENDNODE), 4, right_ascending_node_);
    ExtractDouble(line_two_.substr(TLE2_COL_ECCENTRICITY,
                TLE2_LEN_ECCENTRICITY), -1, eccentricity_);
    ExtractDouble(line_two_.substr(TLE2_COL_ARGPERIGEE,
                TLE2_LEN_ARGPERIGEE), 4, argument_perigee_);
    ExtractDouble(line_two_.substr(TLE2_COL_MEANANOMALY,
                TLE2_LEN_MEANANOMALY), 4, mean_anomaly_);
    ExtractDouble(line_two_.substr(TLE2_COL_MEANMOTION,
                TLE2_LEN_MEANMOTION), 3, mean_motion_);
    ExtractInteger(line_two_.substr(TLE2_COL_REVATEPOCH,
                TLE2_LEN_REVATEPOCH), orbit_number_);
    
    if (year < 57)
        year += 2000;
    else
        year += 1900;

    epoch_ = DateTime(year, day);
}